

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_effect.cpp
# Opt level: O3

void P_DrawSplash(int count,DVector3 *pos,DAngle *angle,int kind)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  particle_t *ppVar7;
  
  iVar4 = yorange;
  iVar3 = orange;
  if ((kind == 1) && (count != 0)) {
    do {
      ppVar7 = JitterParticle(10,1.0);
      if (ppVar7 == (particle_t *)0x0) {
        return;
      }
      ppVar7->size = 2.0;
      uVar5 = FRandom::GenRand32(&M_Random);
      iVar6 = iVar3;
      if (-1 < (char)uVar5) {
        iVar6 = iVar4;
      }
      ppVar7->color = iVar6;
      uVar5 = FRandom::GenRand32(&M_Random);
      (ppVar7->Vel).Z = (double)(uVar5 & 0xff) * -0.0078125 + (ppVar7->Vel).Z;
      (ppVar7->Acc).Z = (ppVar7->Acc).Z + -0.125;
      uVar5 = FRandom::GenRand32(&M_Random);
      (ppVar7->Acc).X = (double)(int)((uVar5 & 0xff) - 0x80) * 0.0001220703125 + (ppVar7->Acc).X;
      uVar5 = FRandom::GenRand32(&M_Random);
      (ppVar7->Acc).Y = (double)(int)((uVar5 & 0xff) - 0x80) * 0.0001220703125 + (ppVar7->Acc).Y;
      dVar1 = pos->Z;
      uVar5 = FRandom::GenRand32(&M_Random);
      (ppVar7->Pos).Z = (double)(uVar5 & 0xff) * -0.015625 + dVar1;
      uVar5 = FRandom::GenRand32(&M_Random);
      angle->Degrees = (double)(uVar5 & 0xff) * 0.17578125 + angle->Degrees;
      dVar1 = pos->X;
      uVar5 = FRandom::GenRand32(&M_Random);
      dVar2 = FFastTrig::cos(&fasttrig,angle->Degrees * 11930464.711111112 + 6755399441055744.0);
      (ppVar7->Pos).X = dVar2 * (double)(uVar5 & 0xf) + dVar1;
      dVar1 = pos->Y;
      uVar5 = FRandom::GenRand32(&M_Random);
      dVar2 = FFastTrig::sin(&fasttrig,angle->Degrees * 11930464.711111112 + 6755399441055744.0);
      (ppVar7->Pos).Y = dVar2 * (double)(uVar5 & 0xf) + dVar1;
      count = count + -1;
    } while (count != 0);
  }
  return;
}

Assistant:

void P_DrawSplash (int count, const DVector3 &pos, DAngle angle, int kind)
{
	int color1, color2;

	switch (kind)
	{
	case 1:		// Spark
		color1 = orange;
		color2 = yorange;
		break;
	default:
		return;
	}

	for (; count; count--)
	{
		particle_t *p = JitterParticle (10);

		if (!p)
			break;

		p->size = 2;
		p->color = M_Random() & 0x80 ? color1 : color2;
		p->Vel.Z -= M_Random () / 128.;
		p->Acc.Z -= 1./8;
		p->Acc.X += (M_Random () - 128) / 8192.;
		p->Acc.Y += (M_Random () - 128) / 8192.;
		p->Pos.Z = pos.Z - M_Random () / 64.;
		angle += M_Random() * (45./256);
		p->Pos.X = pos.X + (M_Random() & 15)*angle.Cos();
		p->Pos.Y = pos.Y + (M_Random() & 15)*angle.Sin();
	}
}